

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void applyNumericAffinity(Mem *pRec,int bTryForInt)

{
  long lVar1;
  int iVar2;
  int in_ESI;
  Mem *in_RDI;
  long in_FS_OFFSET;
  int rc;
  u8 enc;
  double rValue;
  u8 in_stack_00000053;
  int in_stack_00000054;
  double *in_stack_00000058;
  char *in_stack_00000060;
  undefined4 in_stack_ffffffffffffffd8;
  undefined3 in_stack_ffffffffffffffe0;
  undefined4 uVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = CONCAT13(in_RDI->enc,in_stack_ffffffffffffffe0);
  iVar2 = sqlite3AtoF(in_stack_00000060,in_stack_00000058,in_stack_00000054,in_stack_00000053);
  if (0 < iVar2) {
    if ((iVar2 == 1) &&
       (iVar2 = alsoAnInt(in_RDI,(double)CONCAT44(in_ESI,uVar3),
                          (i64 *)CONCAT44(1,in_stack_ffffffffffffffd8)), iVar2 != 0)) {
      in_RDI->flags = in_RDI->flags | 4;
    }
    else {
      (in_RDI->u).i = -1;
      in_RDI->flags = in_RDI->flags | 8;
      if (in_ESI != 0) {
        sqlite3VdbeIntegerAffinity((Mem *)CONCAT44(in_ESI,uVar3));
      }
    }
    in_RDI->flags = in_RDI->flags & 0xfffd;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void applyNumericAffinity(Mem *pRec, int bTryForInt){
  double rValue;
  u8 enc = pRec->enc;
  int rc;
  assert( (pRec->flags & (MEM_Str|MEM_Int|MEM_Real|MEM_IntReal))==MEM_Str );
  rc = sqlite3AtoF(pRec->z, &rValue, pRec->n, enc);
  if( rc<=0 ) return;
  if( rc==1 && alsoAnInt(pRec, rValue, &pRec->u.i) ){
    pRec->flags |= MEM_Int;
  }else{
    pRec->u.r = rValue;
    pRec->flags |= MEM_Real;
    if( bTryForInt ) sqlite3VdbeIntegerAffinity(pRec);
  }
  /* TEXT->NUMERIC is many->one.  Hence, it is important to invalidate the
  ** string representation after computing a numeric equivalent, because the
  ** string representation might not be the canonical representation for the
  ** numeric value.  Ticket [343634942dd54ab57b7024] 2018-01-31. */
  pRec->flags &= ~MEM_Str;
}